

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O0

void __thiscall bitfoot::Bitfoot::AddBishopMoves<false>(Bitfoot *this,uint64_t dests)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int to;
  int from;
  uint64_t dest;
  uint64_t pieces;
  uint64_t dests_local;
  Bitfoot *this_local;
  
  if ((dests != 0) && (this->pc[6] != 0)) {
    dest = this->pc[6];
    pieces = dests;
    dests_local = (uint64_t)this;
    while (dest != 0) {
      iVar2 = PopLowSquare(&dest,&local_2c);
      _to = this->slider[iVar2] & pieces & (this->pc[0] ^ 0xffffffffffffffff);
      while (iVar2 = local_2c, _to != 0) {
        iVar3 = PopLowSquare((uint64_t *)&to,&local_30);
        bVar1 = Pinned<false>(this,iVar2,iVar3);
        iVar3 = local_2c;
        iVar2 = local_30;
        if (!bVar1) {
          if ((int)(&_board)[local_30] < 4) {
            iVar4 = StaticExchange<false,true>(this,local_2c,local_30);
            AddMove<false,(bitfoot::MoveType)1>(this,6,iVar3,iVar2,iVar4,(&_board)[local_30],0);
          }
          else {
            iVar4 = ValueOf((&_board)[local_30]);
            AddMove<false,(bitfoot::MoveType)1>
                      (this,6,iVar3,iVar2,iVar4 + -0x14,(&_board)[local_30],0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void AddBishopMoves(const uint64_t dests) {
    if (!dests || !pc[color|Bishop]) {
      return;
    }

    uint64_t pieces = pc[color|Bishop];
    uint64_t dest;
    int from;
    int to;

    while (pieces) {
      dest = (slider[PopLowSquare(pieces, from)] & dests & ~pc[color]);
      while (dest) {
        if (!Pinned<color>(from, PopLowSquare(dest, to))) {
          if (_board[to] >= Knight) {
            AddMove<color, Normal>((color|Bishop), from, to,
                                   (ValueOf(_board[to]) - 20), _board[to], 0);
          }
          else {
            AddMove<color, Normal>((color|Bishop), from, to,
                                   StaticExchange<color, true>(from, to),
                                   _board[to], 0);
          }
        }
      }
    }
  }